

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-id.c++
# Opt level: O0

uint64_t capnp::compiler::generateGroupId(uint64_t parentId,uint16_t groupIndex)

{
  byte *pbVar1;
  uint local_ec;
  ulong uStack_e8;
  uint i_2;
  uint64_t result;
  ArrayPtr<const_unsigned_char> resultBytes;
  undefined1 local_c0 [8];
  TypeIdGenerator generator;
  uint i_1;
  uint i;
  byte bytes [10];
  uint16_t groupIndex_local;
  uint64_t parentId_local;
  
  bytes._2_2_ = groupIndex;
  unique0x10000121 = parentId;
  memset(&i_1,0,10);
  for (generator.ctx.block[0xf] = 0; generator.ctx.block[0xf] < 8;
      generator.ctx.block[0xf] = generator.ctx.block[0xf] + 1) {
    *(char *)((long)&i_1 + (ulong)generator.ctx.block[0xf]) =
         (char)(stack0xfffffffffffffff0 >> ((byte)(generator.ctx.block[0xf] << 3) & 0x3f));
  }
  for (generator.ctx.block[0xe] = 0; generator.ctx.block[0xe] < 2;
      generator.ctx.block[0xe] = generator.ctx.block[0xe] + 1) {
    bytes[generator.ctx.block[0xe]] =
         (byte)((int)(uint)(ushort)bytes._2_2_ >> ((byte)(generator.ctx.block[0xe] << 3) & 0x1f));
  }
  TypeIdGenerator::TypeIdGenerator((TypeIdGenerator *)local_c0);
  kj::ArrayPtr<unsigned_char_const>::ArrayPtr<10ul>
            ((ArrayPtr<unsigned_char_const> *)&resultBytes.size_,(uchar (*) [10])&i_1);
  TypeIdGenerator::update((TypeIdGenerator *)local_c0,stack0xffffffffffffff30);
  _result = TypeIdGenerator::finish((TypeIdGenerator *)local_c0);
  uStack_e8 = 0;
  for (local_ec = 0; local_ec < 8; local_ec = local_ec + 1) {
    pbVar1 = kj::ArrayPtr<const_unsigned_char>::operator[]
                       ((ArrayPtr<const_unsigned_char> *)&result,(ulong)local_ec);
    uStack_e8 = uStack_e8 << 8 | (ulong)*pbVar1;
  }
  return uStack_e8 | 0x8000000000000000;
}

Assistant:

uint64_t generateGroupId(uint64_t parentId, uint16_t groupIndex) {
  // Compute ID by hashing the concatenation of the parent ID and the group index, and
  // then taking the first 8 bytes.

  kj::byte bytes[sizeof(uint64_t) + sizeof(uint16_t)]{};
  for (uint i = 0; i < sizeof(uint64_t); i++) {
    bytes[i] = (parentId >> (i * 8)) & 0xff;
  }
  for (uint i = 0; i < sizeof(uint16_t); i++) {
    bytes[sizeof(uint64_t) + i] = (groupIndex >> (i * 8)) & 0xff;
  }

  TypeIdGenerator generator;
  generator.update(bytes);

  kj::ArrayPtr<const kj::byte> resultBytes = generator.finish();

  uint64_t result = 0;
  for (uint i = 0; i < sizeof(uint64_t); i++) {
    result = (result << 8) | resultBytes[i];
  }

  return result | (1ull << 63);
}